

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::setBasis
          (SPxSolverBase<double> *this,VarStatus *p_rows,VarStatus *p_cols)

{
  Status SVar1;
  long lVar2;
  Desc ds;
  Desc local_60;
  
  if ((this->super_SPxBasisBase<double>).thestatus == NO_PROBLEM) {
    SPxBasisBase<double>::load(&this->super_SPxBasisBase<double>,this,false);
  }
  SPxBasisBase<double>::Desc::Desc(&local_60,&(this->super_SPxBasisBase<double>).thedesc);
  for (lVar2 = 0;
      lVar2 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar2 = lVar2 + 1) {
    SVar1 = varStatusToBasisStatusRow(this,(int)lVar2,p_rows[lVar2]);
    local_60.rowstat.data[lVar2] = SVar1;
  }
  for (lVar2 = 0;
      lVar2 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar2 = lVar2 + 1) {
    SVar1 = varStatusToBasisStatusCol(this,(int)lVar2,p_cols[lVar2]);
    local_60.colstat.data[lVar2] = SVar1;
  }
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x58])(this,&local_60);
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxBasisBase<double>::Desc::~Desc(&local_60);
  return;
}

Assistant:

void SPxSolverBase<R>::setBasis(const VarStatus p_rows[], const VarStatus p_cols[])
   {
      if(SPxBasisBase<R>::status() == SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::load(this, false);

      typename SPxBasisBase<R>::Desc ds = this->desc();
      int i;

      for(i = 0; i < this->nRows(); i++)
         ds.rowStatus(i) = varStatusToBasisStatusRow(i, p_rows[i]);

      for(i = 0; i < this->nCols(); i++)
         ds.colStatus(i) = varStatusToBasisStatusCol(i, p_cols[i]);

      loadBasis(ds);
      forceRecompNonbasicValue();
   }